

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

void runpprop(runcxdef *ctx,uchar **codepp,objnum callobj,prpnum callprop,objnum obj,prpnum prop,
             int inh,int argc,objnum self)

{
  uint uVar1;
  int iVar2;
  errcxdef *peVar3;
  short sVar4;
  undefined4 in_ECX;
  undefined2 uVar5;
  undefined4 in_EDX;
  undefined2 uVar6;
  runcxdef *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  undefined2 in_R9W;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_00000010;
  errdef fr_;
  runsdef *sp_ret;
  objnum otherobj;
  int err;
  int times_through;
  objnum target;
  runsdef sval;
  int typ;
  uchar *val;
  prpdef *prpptr;
  objdef *objptr;
  uint saveofs;
  uint pofs;
  int in_stack_000003fc;
  prpnum in_stack_00000402;
  objnum in_stack_00000404;
  objnum in_stack_00000406;
  uchar *in_stack_00000408;
  runcxdef *in_stack_00000410;
  prpnum in_stack_fffffffffffffe28;
  objnum in_stack_fffffffffffffe2a;
  undefined2 in_stack_fffffffffffffe2c;
  mcmon in_stack_fffffffffffffe2e;
  int in_stack_fffffffffffffe30;
  undefined2 in_stack_fffffffffffffe34;
  mcmon in_stack_fffffffffffffe36;
  uint in_stack_fffffffffffffe38;
  dattyp in_stack_fffffffffffffe3c;
  runcxdef *in_stack_fffffffffffffe40;
  mcmcxdef *in_stack_fffffffffffffe60;
  __jmp_buf_tag _Stack_130;
  long local_68;
  ushort local_5e;
  int local_5c;
  int local_58;
  uint local_3c;
  uchar *local_38;
  uchar *local_30;
  uchar *local_28;
  uint in_stack_ffffffffffffffe0;
  runcxdef *ctx_00;
  
  uVar6 = (undefined2)in_EDX;
  uVar5 = (undefined2)in_ECX;
  sVar4 = (short)in_R8D;
  local_58 = 0;
  local_68 = in_RDI[4] + (long)in_stack_00000010 * -0x10;
  ctx_00 = in_RSI;
  if (sVar4 == -1) {
    *(undefined4 *)(*(long *)*in_RDI + 0x68) = 0;
    runsign((runcxdef *)
            CONCAT26(in_stack_fffffffffffffe36,
                     CONCAT24(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)),
            CONCAT22(in_stack_fffffffffffffe2e,in_stack_fffffffffffffe2c));
  }
  while( true ) {
    uVar1 = objgetap(in_stack_fffffffffffffe60,(objnum)((ulong)in_RSI >> 0x30),
                     (prpnum)((ulong)in_RSI >> 0x20),(objnum *)CONCAT44(in_EDX,in_ECX),in_R8D);
    if (uVar1 == 0) {
      runpush(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
              (runsdef *)
              CONCAT26(in_stack_fffffffffffffe36,
                       CONCAT24(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)));
      return;
    }
    local_28 = mcmlck((mcmcxdef *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                      in_stack_fffffffffffffe36);
    local_5c = _setjmp(&_Stack_130);
    if (local_5c != 0) break;
    in_stack_fffffffffffffe60 = *(mcmcxdef **)*in_RDI;
    *(undefined1 **)*in_RDI = &stack0xfffffffffffffe60;
    local_30 = local_28 + uVar1;
    local_38 = local_30 + 6;
    local_3c = (uint)local_30[2];
    in_stack_fffffffffffffe40 = (runcxdef *)(ulong)(local_3c - 6);
    switch(in_stack_fffffffffffffe40) {
    case (runcxdef *)0x0:
      if (ctx_00 != (runcxdef *)0x0) {
        in_stack_ffffffffffffffe0 =
             runcpsav((runcxdef *)
                      CONCAT26(in_stack_fffffffffffffe36,
                               CONCAT24(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)),
                      (uchar **)
                      CONCAT26(in_stack_fffffffffffffe2e,
                               CONCAT24(in_stack_fffffffffffffe2c,
                                        CONCAT22(in_stack_fffffffffffffe2a,in_stack_fffffffffffffe28
                                                ))),0,0);
      }
      runexe(in_stack_00000410,in_stack_00000408,in_stack_00000406,in_stack_00000404,
             in_stack_00000402,in_stack_000003fc);
      if (ctx_00 != (runcxdef *)0x0) {
        peVar3 = (errcxdef *)
                 runcprst((runcxdef *)
                          CONCAT26(in_stack_fffffffffffffe36,
                                   CONCAT24(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)),
                          CONCAT22(in_stack_fffffffffffffe2e,in_stack_fffffffffffffe2c),
                          in_stack_fffffffffffffe2a,in_stack_fffffffffffffe28);
        ctx_00->runcxerr = peVar3;
      }
      break;
    default:
      runpbuf((runcxdef *)CONCAT44(in_EDX,in_ECX),in_R8D,in_stack_fffffffffffffe40);
      break;
    case (runcxdef *)0x3:
      outfmt((tiocxdef *)
             CONCAT26(in_stack_fffffffffffffe36,
                      CONCAT24(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)),
             (uchar *)CONCAT26(in_stack_fffffffffffffe2e,
                               CONCAT24(in_stack_fffffffffffffe2c,
                                        CONCAT22(in_stack_fffffffffffffe2a,in_stack_fffffffffffffe28
                                                ))));
      break;
    case (runcxdef *)0x8:
      break;
    case (runcxdef *)0xa:
      iVar2 = osrp2(local_38);
      local_5e = (ushort)iVar2;
    }
    mcmunlck((mcmcxdef *)
             CONCAT26(in_stack_fffffffffffffe36,
                      CONCAT24(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)),
             in_stack_fffffffffffffe2e);
    if (local_3c == 0x10) {
      in_stack_fffffffffffffe28 = 0;
      in_stack_fffffffffffffe2a = 0;
      in_stack_fffffffffffffe38 = (uint)local_5e;
      in_stack_fffffffffffffe30 = in_stack_00000010;
      runpprop(ctx_00,(uchar **)CONCAT26(uVar6,CONCAT24(uVar5,CONCAT22(sVar4,in_R9W))),
               (objnum)(uVar1 >> 0x10),(prpnum)uVar1,(objnum)(in_stack_ffffffffffffffe0 >> 0x10),
               (prpnum)in_stack_ffffffffffffffe0,unaff_retaddr,in_stack_00000008,
               (objnum)in_stack_00000010);
    }
    *(mcmcxdef **)*in_RDI = in_stack_fffffffffffffe60;
    if (local_3c != 0xe) {
      if (in_RDI[4] != local_68) {
        return;
      }
      runpush(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
              (runsdef *)
              CONCAT26(in_stack_fffffffffffffe36,
                       CONCAT24(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)));
      return;
    }
    local_58 = local_58 + 1;
    if (local_58 != 1) {
      *(undefined4 *)(*(long *)*in_RDI + 0x68) = 0;
      runsign((runcxdef *)
              CONCAT26(in_stack_fffffffffffffe36,
                       CONCAT24(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)),
              CONCAT22(in_stack_fffffffffffffe2e,in_stack_fffffffffffffe2c));
    }
    if (ctx_00 != (runcxdef *)0x0) {
      in_stack_ffffffffffffffe0 =
           runcpsav((runcxdef *)
                    CONCAT26(in_stack_fffffffffffffe36,
                             CONCAT24(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)),
                    (uchar **)
                    CONCAT26(in_stack_fffffffffffffe2e,
                             CONCAT24(in_stack_fffffffffffffe2c,
                                      CONCAT22(in_stack_fffffffffffffe2a,in_stack_fffffffffffffe28))
                            ),0,0);
    }
    (*(code *)in_RDI[0xf])(in_RDI[0x10],sVar4,in_R9W,sVar4);
    if (ctx_00 != (runcxdef *)0x0) {
      peVar3 = (errcxdef *)
               runcprst((runcxdef *)
                        CONCAT26(in_stack_fffffffffffffe36,
                                 CONCAT24(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)),
                        CONCAT22(in_stack_fffffffffffffe2e,in_stack_fffffffffffffe2c),
                        in_stack_fffffffffffffe2a,in_stack_fffffffffffffe28);
      ctx_00->runcxerr = peVar3;
    }
  }
  *(mcmcxdef **)*in_RDI = in_stack_fffffffffffffe60;
  mcmunlck((mcmcxdef *)
           CONCAT26(in_stack_fffffffffffffe36,
                    CONCAT24(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)),
           in_stack_fffffffffffffe2e);
  if ((local_5c < 0x3f5) || (0x3fb < local_5c)) {
    dbgds((dbgcxdef *)in_RDI[0xd]);
  }
  errrse1((errcxdef *)
          CONCAT26(in_stack_fffffffffffffe36,
                   CONCAT24(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)),
          (errdef *)
          CONCAT26(in_stack_fffffffffffffe2e,
                   CONCAT24(in_stack_fffffffffffffe2c,
                            CONCAT22(in_stack_fffffffffffffe2a,in_stack_fffffffffffffe28))));
}

Assistant:

void runpprop(runcxdef *ctx, uchar *noreg *codepp,
              objnum callobj, prpnum callprop,
              noreg objnum obj, prpnum prop, int inh, int argc, objnum self)
{
    uint     pofs;
    uint     saveofs;
    objdef  *objptr;
    prpdef  *prpptr;
    uchar   *val;
    int      typ;
    runsdef  sval;
    objnum   target;
    int      times_through = 0;
    int      err;
	objnum   otherobj;
	runsdef *sp_ret;

	NOREG((&obj, &codepp));

	/* 
	 *   Note the initial stack pointer before arguments.  This is the stack
	 *   slot where the caller expects the return value to be placed on
	 *   return. 
	 */
	sp_ret = ctx->runcxsp - argc;

    if (obj == MCMONINV) runsig(ctx, ERR_RUNNOBJ);
    
startover:
    pofs = objgetap(ctx->runcxmem, obj, prop, &target, inh);
    
    /* if nothing was found, push nil */
    if (!pofs)
    {
		runpush(ctx, DAT_NIL, &sval);
        return;
    }

    /* found a property; get the prpdef, and the value and type of data */
    objptr = mcmlck(ctx->runcxmem, target);
    ERRBEGIN(ctx->runcxerr)         /* catch errors so we can unlock object */

    prpptr = (prpdef *)(((uchar *)objptr) + pofs);
    val = prpvalp(prpptr);
    typ = prptype(prpptr);

    /* determine what to do based on property type */
    switch(typ)
    {
    case DAT_CODE:
        /* save caller's code offset - caller's object may move */
        if (codepp)
            saveofs = runcpsav(ctx, codepp, callobj, callprop);
        
        /* execute the code */
        runexe(ctx, val, self, target, prop, argc);
        
        /* restore caller's code pointer in case object moved */
        if (codepp)
            *codepp = runcprst(ctx, saveofs, callobj, callprop);
        break;

    case DAT_REDIR:
        otherobj = osrp2(val);
        break;

    case DAT_DSTRING:
        outfmt(ctx->runcxtio, val);
        break;
        
    case DAT_DEMAND:
        break;
        
    default:
        runpbuf(ctx, typ, val);
        break;
    }

    /* we're done - unlock the object */
    mcmunlck(ctx->runcxmem, target);

    /* if it's redirected, redirect it now */
    if (typ == DAT_REDIR)
    {
        runpprop(ctx, codepp, callobj, callprop, otherobj, prop,
                 FALSE, argc, otherobj);
    }

    /* if an error occurs, unlock the object, and resignal the error */
    ERRCATCH(ctx->runcxerr, err)
        mcmunlck(ctx->runcxmem, target);
        if (err < ERR_RUNEXIT || err > ERR_RUNEXITOBJ)
            dbgdump(ctx->runcxdbg);                       /* dump the stack */
        errrse(ctx->runcxerr);
    ERREND(ctx->runcxerr)

    /* apply special handling for set-on-first-use data */
    if (typ == DAT_DEMAND)
    {
        /*
         *   if we've already done this, the property isn't being set by
         *   the callback, so we'll never get out of this loop - abort if
         *   so 
         */
        if (++times_through != 1)
            runsig(ctx, ERR_DMDLOOP);

        /* save caller's code offset - caller's object may move */
        if (codepp)
            saveofs = runcpsav(ctx, codepp, callobj, callprop);

        /* invoke the callback to set the property on demand */
        (*ctx->runcxdmd)(ctx->runcxdmc, obj, prop);

        /* restore caller's code pointer */
        if (codepp)
            *codepp = runcprst(ctx, saveofs, callobj, callprop);

        /* try again now that it's been set up */
        goto startover;
	}

	/* 
	 *   If the property invocation didn't push a return value onto the
	 *   stack, push nil as the default result.  *All* property calls must
	 *   yield a value, since our caller might assume that they can pop a
	 *   result.  If the caller pops a result and we don't provide one, the
	 *   stack will be corrupted.  To ensure this doesn't happen, push a
	 *   default nil result if the stack pointer is where it was before the
	 *   caller pushed our arguments.
	 */
	if (ctx->runcxsp == sp_ret)
		runpush(ctx, DAT_NIL, &sval);
}